

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O3

RangeValue __thiscall CoreML::RangeValue::divideAndRoundUp(RangeValue *this,size_t other)

{
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar1;
  size_t val;
  RangeValue RVar2;
  RangeValue local_10;
  
  if ((other == 0) || (this->_isUnbound != false)) {
    RangeValue(&local_10);
    uVar1 = extraout_RAX;
  }
  else {
    if (this->_val == 0) {
      val = 0;
    }
    else {
      val = (this->_val - 1) / other + 1;
    }
    RangeValue(&local_10,val);
    uVar1 = extraout_RAX_00;
  }
  RVar2._1_7_ = (undefined7)((ulong)uVar1 >> 8);
  RVar2._isUnbound = local_10._isUnbound;
  RVar2._val = local_10._val;
  return RVar2;
}

Assistant:

RangeValue RangeValue::divideAndRoundUp(size_t other) const {
    if (_isUnbound || other == 0) {
        return RangeValue();
    }
    else if (_val == 0) {
        return RangeValue(0);
    }
    else {
        return ((_val - 1) / other) + 1;
    }
}